

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryAnim(AssbinExport *this,IOStream *container,aiAnimation *anim)

{
  uint a;
  ulong uVar1;
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_008df8c0;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x123b;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  chunk.container = container;
  Write<aiString>(&chunk.super_IOStream,&anim->mName);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&anim->mDuration,8,1);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&anim->mTicksPerSecond,8,1);
  Write<unsigned_int>(&chunk.super_IOStream,&anim->mNumChannels);
  for (uVar1 = 0; uVar1 < anim->mNumChannels; uVar1 = uVar1 + 1) {
    WriteBinaryNodeAnim(this,&chunk.super_IOStream,anim->mChannels[uVar1]);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&chunk);
  return;
}

Assistant:

void WriteBinaryAnim( IOStream * container, const aiAnimation* anim )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIANIMATION );

        Write<aiString>(&chunk,anim->mName);
        Write<double>(&chunk,anim->mDuration);
        Write<double>(&chunk,anim->mTicksPerSecond);
        Write<unsigned int>(&chunk,anim->mNumChannels);

        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            const aiNodeAnim* nd = anim->mChannels[a];
            WriteBinaryNodeAnim(&chunk,nd);
        }
    }